

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

bool embree::avx2::ConeCurveMiIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Geometry *pGVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ulong uVar21;
  undefined1 auVar22 [32];
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  byte bVar57;
  ulong uVar58;
  Scene *pSVar59;
  undefined1 (*pauVar60) [16];
  bool bVar61;
  ulong uVar62;
  float fVar63;
  undefined1 auVar64 [16];
  float fVar72;
  float fVar73;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar74;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar78;
  float fVar87;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar85;
  float fVar86;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar98;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar111;
  float fVar112;
  float fVar118;
  float fVar120;
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar119;
  float fVar121;
  float fVar123;
  undefined1 auVar117 [32];
  float fVar127;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  float fVar146;
  float fVar147;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  float fVar167;
  undefined1 auVar168 [28];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar169 [32];
  undefined1 auVar171 [64];
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar178 [64];
  undefined1 auVar182 [32];
  float fVar183;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_640 [16];
  size_t local_630;
  Scene *local_628;
  RayK<4> *local_620;
  Primitive *local_618;
  RTCFilterFunctionNArguments local_610;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  RTCHitN local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  uint local_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [16];
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  uint local_1a0 [4];
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined4 uStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar170 [32];
  
  pSVar59 = context->scene;
  local_1a0[0] = line->sharedGeomID;
  uVar4 = (line->v0).field_0.i[0];
  pGVar12 = (pSVar59->geometries).items[local_1a0[0]].ptr;
  lVar13 = *(long *)&pGVar12[1].time_range.upper;
  p_Var14 = pGVar12[1].intersectionFilterN;
  uVar5 = (line->v0).field_0.i[1];
  uVar6 = (line->v0).field_0.i[2];
  uVar7 = (line->v0).field_0.i[4];
  auVar65._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar7 * (long)p_Var14);
  auVar65._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar4 * (long)p_Var14);
  uVar8 = (line->v0).field_0.i[3];
  uVar9 = (line->v0).field_0.i[5];
  auVar84._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar9 * (long)p_Var14);
  auVar84._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar5 * (long)p_Var14);
  uVar10 = (line->v0).field_0.i[6];
  auVar91._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar10 * (long)p_Var14);
  auVar91._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar6 * (long)p_Var14);
  uVar11 = (line->v0).field_0.i[7];
  auVar99._16_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar11 * (long)p_Var14);
  auVar99._0_16_ = *(undefined1 (*) [16])(lVar13 + (ulong)uVar8 * (long)p_Var14);
  auVar64 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar7 + 1) * (long)p_Var14);
  auVar143._0_16_ =
       ZEXT116(0) * auVar64 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar13 + (ulong)(uVar4 + 1) * (long)p_Var14);
  auVar143._16_16_ = ZEXT116(1) * auVar64;
  auVar64 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar9 + 1) * (long)p_Var14);
  auVar113._0_16_ =
       ZEXT116(0) * auVar64 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar13 + (ulong)(uVar5 + 1) * (long)p_Var14);
  auVar113._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar64;
  auVar64 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar10 + 1) * (long)p_Var14);
  auVar128._0_16_ =
       ZEXT116(0) * auVar64 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar13 + (ulong)(uVar6 + 1) * (long)p_Var14);
  auVar128._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar64;
  auVar64 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar11 + 1) * (long)p_Var14);
  auVar136._0_16_ =
       ZEXT116(0) * auVar64 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar13 + (ulong)(uVar8 + 1) * (long)p_Var14);
  auVar136._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar64;
  auVar153 = vunpcklps_avx(auVar65,auVar91);
  auVar141 = vunpckhps_avx(auVar65,auVar91);
  auVar165 = vunpcklps_avx(auVar84,auVar99);
  auVar102 = vunpckhps_avx(auVar84,auVar99);
  auVar109 = vunpcklps_avx(auVar153,auVar165);
  auVar153 = vunpckhps_avx(auVar153,auVar165);
  auVar115 = vunpcklps_avx(auVar141,auVar102);
  auVar165 = vunpckhps_avx(auVar141,auVar102);
  auVar91 = vpunpckldq_avx2(auVar143,auVar128);
  auVar102 = vpunpckhdq_avx2(auVar143,auVar128);
  auVar99 = vpunpckldq_avx2(auVar113,auVar136);
  auVar84 = vpunpckhdq_avx2(auVar113,auVar136);
  auVar113 = vpunpckldq_avx2(auVar91,auVar99);
  uVar2 = line->leftExists;
  uVar3 = line->rightExists;
  auVar141 = vpcmpeqd_avx2(auVar143,auVar143);
  auVar65 = vpcmpeqd_avx2(auVar141,(undefined1  [32])(line->primIDs).field_0);
  local_1a0[1] = local_1a0[0];
  local_1a0[2] = local_1a0[0];
  local_1a0[3] = local_1a0[0];
  uStack_190 = local_1a0[0];
  uStack_18c = local_1a0[0];
  uStack_188 = local_1a0[0];
  uStack_184 = local_1a0[0];
  fVar147 = *(float *)(ray + k * 4 + 0x40);
  local_520._4_4_ = fVar147;
  local_520._0_4_ = fVar147;
  fStack_518 = fVar147;
  fStack_514 = fVar147;
  fStack_510 = fVar147;
  fStack_50c = fVar147;
  fStack_508 = fVar147;
  register0x000014dc = fVar147;
  fStack_e4 = *(float *)(ray + k * 4 + 0x50);
  local_1c0._4_4_ = fStack_e4;
  local_1c0._0_4_ = fStack_e4;
  fStack_1b8 = fStack_e4;
  fStack_1b4 = fStack_e4;
  fStack_1b0 = fStack_e4;
  fStack_1ac = fStack_e4;
  fStack_1a8 = fStack_e4;
  register0x000015dc = fStack_e4;
  local_2c0 = *(float *)(ray + k * 4 + 0x60);
  auVar91 = vpunpckhdq_avx2(auVar91,auVar99);
  auVar64 = vfmadd231ps_fma(ZEXT432((uint)(local_2c0 * local_2c0)),_local_1c0,_local_1c0);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),_local_520,_local_520);
  auVar114._0_4_ = auVar64._0_4_;
  auVar114._4_4_ = auVar114._0_4_;
  auVar114._8_4_ = auVar114._0_4_;
  auVar114._12_4_ = auVar114._0_4_;
  auVar114._16_4_ = auVar114._0_4_;
  auVar114._20_4_ = auVar114._0_4_;
  auVar114._24_4_ = auVar114._0_4_;
  auVar114._28_4_ = auVar114._0_4_;
  auVar141 = vrcpps_avx(auVar114);
  auVar99 = vpunpckldq_avx2(auVar102,auVar84);
  auVar84 = vpunpckhdq_avx2(auVar102,auVar84);
  auVar66._8_4_ = 0x3f800000;
  auVar66._0_8_ = 0x3f8000003f800000;
  auVar66._12_4_ = 0x3f800000;
  auVar66._16_4_ = 0x3f800000;
  auVar66._20_4_ = 0x3f800000;
  auVar66._24_4_ = 0x3f800000;
  auVar66._28_4_ = 0x3f800000;
  auVar64 = vfnmadd213ps_fma(auVar114,auVar141,auVar66);
  auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar141,auVar141);
  auVar116._4_4_ = (auVar109._4_4_ + auVar113._4_4_) * 0.5;
  auVar116._0_4_ = (auVar109._0_4_ + auVar113._0_4_) * 0.5;
  auVar116._8_4_ = (auVar109._8_4_ + auVar113._8_4_) * 0.5;
  auVar116._12_4_ = (auVar109._12_4_ + auVar113._12_4_) * 0.5;
  auVar116._16_4_ = (auVar109._16_4_ + auVar113._16_4_) * 0.5;
  auVar116._20_4_ = (auVar109._20_4_ + auVar113._20_4_) * 0.5;
  auVar116._24_4_ = (auVar109._24_4_ + auVar113._24_4_) * 0.5;
  auVar116._28_4_ = auVar109._28_4_ + auVar113._28_4_;
  auVar141._4_4_ = (auVar91._4_4_ + auVar153._4_4_) * 0.5;
  auVar141._0_4_ = (auVar91._0_4_ + auVar153._0_4_) * 0.5;
  auVar141._8_4_ = (auVar91._8_4_ + auVar153._8_4_) * 0.5;
  auVar141._12_4_ = (auVar91._12_4_ + auVar153._12_4_) * 0.5;
  auVar141._16_4_ = (auVar91._16_4_ + auVar153._16_4_) * 0.5;
  auVar141._20_4_ = (auVar91._20_4_ + auVar153._20_4_) * 0.5;
  auVar141._24_4_ = (auVar91._24_4_ + auVar153._24_4_) * 0.5;
  auVar141._28_4_ = auVar91._28_4_ + auVar153._28_4_;
  auVar102._4_4_ = (auVar115._4_4_ + auVar99._4_4_) * 0.5;
  auVar102._0_4_ = (auVar115._0_4_ + auVar99._0_4_) * 0.5;
  auVar102._8_4_ = (auVar115._8_4_ + auVar99._8_4_) * 0.5;
  auVar102._12_4_ = (auVar115._12_4_ + auVar99._12_4_) * 0.5;
  auVar102._16_4_ = (auVar115._16_4_ + auVar99._16_4_) * 0.5;
  auVar102._20_4_ = (auVar115._20_4_ + auVar99._20_4_) * 0.5;
  auVar102._24_4_ = (auVar115._24_4_ + auVar99._24_4_) * 0.5;
  auVar102._28_4_ = 0x3f000000;
  fVar156 = *(float *)(ray + k * 4 + 0x10);
  auVar148._4_4_ = fVar156;
  auVar148._0_4_ = fVar156;
  auVar148._8_4_ = fVar156;
  auVar148._12_4_ = fVar156;
  auVar148._16_4_ = fVar156;
  auVar148._20_4_ = fVar156;
  auVar148._24_4_ = fVar156;
  auVar148._28_4_ = fVar156;
  auVar141 = vsubps_avx(auVar141,auVar148);
  fVar158 = *(float *)(ray + k * 4 + 0x20);
  auVar164._4_4_ = fVar158;
  auVar164._0_4_ = fVar158;
  auVar164._8_4_ = fVar158;
  auVar164._12_4_ = fVar158;
  auVar164._16_4_ = fVar158;
  auVar164._20_4_ = fVar158;
  auVar164._24_4_ = fVar158;
  auVar164._28_4_ = fVar158;
  auVar102 = vsubps_avx(auVar102,auVar164);
  auVar22._4_4_ = local_2c0 * auVar102._4_4_;
  auVar22._0_4_ = local_2c0 * auVar102._0_4_;
  auVar22._8_4_ = local_2c0 * auVar102._8_4_;
  auVar22._12_4_ = local_2c0 * auVar102._12_4_;
  auVar22._16_4_ = local_2c0 * auVar102._16_4_;
  auVar22._20_4_ = local_2c0 * auVar102._20_4_;
  auVar22._24_4_ = local_2c0 * auVar102._24_4_;
  auVar22._28_4_ = auVar102._28_4_;
  auVar79 = vfmadd231ps_fma(auVar22,_local_1c0,auVar141);
  fVar160 = *(float *)(ray + k * 4);
  auVar129._4_4_ = fVar160;
  auVar129._0_4_ = fVar160;
  auVar129._8_4_ = fVar160;
  auVar129._12_4_ = fVar160;
  auVar129._16_4_ = fVar160;
  auVar129._20_4_ = fVar160;
  auVar129._24_4_ = fVar160;
  auVar129._28_4_ = fVar160;
  auVar141 = vsubps_avx(auVar116,auVar129);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),_local_520,auVar141);
  fVar111 = auVar79._0_4_ * auVar64._0_4_;
  fVar118 = auVar79._4_4_ * auVar64._4_4_;
  fVar120 = auVar79._8_4_ * auVar64._8_4_;
  fVar122 = auVar79._12_4_ * auVar64._12_4_;
  local_5e0 = ZEXT1632(CONCAT412(fVar122,CONCAT48(fVar120,CONCAT44(fVar118,fVar111))));
  auVar67._0_4_ = fVar160 + fVar147 * fVar111;
  auVar67._4_4_ = fVar160 + fVar147 * fVar118;
  auVar67._8_4_ = fVar160 + fVar147 * fVar120;
  auVar67._12_4_ = fVar160 + fVar147 * fVar122;
  auVar67._16_4_ = fVar160 + fVar147 * 0.0;
  auVar67._20_4_ = fVar160 + fVar147 * 0.0;
  auVar67._24_4_ = fVar160 + fVar147 * 0.0;
  auVar67._28_4_ = fVar160 + 0.0;
  auVar130._0_4_ = fVar156 + fStack_e4 * fVar111;
  auVar130._4_4_ = fVar156 + fStack_e4 * fVar118;
  auVar130._8_4_ = fVar156 + fStack_e4 * fVar120;
  auVar130._12_4_ = fVar156 + fStack_e4 * fVar122;
  auVar130._16_4_ = fVar156 + fStack_e4 * 0.0;
  auVar130._20_4_ = fVar156 + fStack_e4 * 0.0;
  auVar130._24_4_ = fVar156 + fStack_e4 * 0.0;
  auVar130._28_4_ = fVar156 + auVar141._28_4_;
  auVar149._0_4_ = fVar158 + local_2c0 * fVar111;
  auVar149._4_4_ = fVar158 + local_2c0 * fVar118;
  auVar149._8_4_ = fVar158 + local_2c0 * fVar120;
  auVar149._12_4_ = fVar158 + local_2c0 * fVar122;
  auVar149._16_4_ = fVar158 + local_2c0 * 0.0;
  auVar149._20_4_ = fVar158 + local_2c0 * 0.0;
  auVar149._24_4_ = fVar158 + local_2c0 * 0.0;
  auVar149._28_4_ = fVar158 + auVar141._28_4_;
  local_440 = vsubps_avx(auVar113,auVar109);
  _local_4e0 = vsubps_avx(auVar67,auVar109);
  local_460 = vsubps_avx(auVar91,auVar153);
  _local_500 = vsubps_avx(auVar130,auVar153);
  local_480 = vsubps_avx(auVar99,auVar115);
  local_420 = vsubps_avx(auVar149,auVar115);
  fVar162 = local_480._0_4_;
  fVar15 = local_480._4_4_;
  auVar153._4_4_ = fVar15 * fVar15;
  auVar153._0_4_ = fVar162 * fVar162;
  fVar16 = local_480._8_4_;
  auVar153._8_4_ = fVar16 * fVar16;
  fVar17 = local_480._12_4_;
  auVar153._12_4_ = fVar17 * fVar17;
  fVar18 = local_480._16_4_;
  auVar153._16_4_ = fVar18 * fVar18;
  fVar19 = local_480._20_4_;
  auVar153._20_4_ = fVar19 * fVar19;
  fVar20 = local_480._24_4_;
  auVar153._24_4_ = fVar20 * fVar20;
  auVar153._28_4_ = auVar109._28_4_;
  auVar64 = vfmadd231ps_fma(auVar153,local_460,local_460);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),local_440,local_440);
  fVar167 = local_420._0_4_;
  fVar172 = local_420._4_4_;
  auVar109._4_4_ = fVar172 * fVar15;
  auVar109._0_4_ = fVar167 * fVar162;
  fVar173 = local_420._8_4_;
  auVar109._8_4_ = fVar173 * fVar16;
  fVar174 = local_420._12_4_;
  auVar109._12_4_ = fVar174 * fVar17;
  fVar175 = local_420._16_4_;
  auVar109._16_4_ = fVar175 * fVar18;
  fVar176 = local_420._20_4_;
  auVar109._20_4_ = fVar176 * fVar19;
  fVar177 = local_420._24_4_;
  auVar109._24_4_ = fVar177 * fVar20;
  auVar109._28_4_ = fVar158;
  auVar79 = vfmadd231ps_fma(auVar109,_local_500,local_460);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),_local_4e0,local_440);
  auVar115._4_4_ = local_2c0 * fVar15;
  auVar115._0_4_ = local_2c0 * fVar162;
  auVar115._8_4_ = local_2c0 * fVar16;
  auVar115._12_4_ = local_2c0 * fVar17;
  auVar115._16_4_ = local_2c0 * fVar18;
  auVar115._20_4_ = local_2c0 * fVar19;
  auVar115._24_4_ = local_2c0 * fVar20;
  auVar115._28_4_ = auVar149._28_4_;
  auVar89 = vfmadd231ps_fma(auVar115,_local_1c0,local_460);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),_local_520,local_440);
  auVar141 = vsubps_avx(auVar165,auVar84);
  fVar163 = auVar141._0_4_;
  fVar88 = auVar141._4_4_;
  fVar95 = auVar141._8_4_;
  fVar96 = auVar141._12_4_;
  fVar97 = auVar141._16_4_;
  fVar179 = auVar141._20_4_;
  fVar180 = auVar141._24_4_;
  fVar23 = local_440._28_4_;
  fVar156 = auVar64._0_4_;
  fVar63 = fVar163 * fVar163 + fVar156;
  fVar158 = auVar64._4_4_;
  fVar72 = fVar88 * fVar88 + fVar158;
  fVar160 = auVar64._8_4_;
  fVar73 = fVar95 * fVar95 + fVar160;
  fVar161 = auVar64._12_4_;
  fVar74 = fVar96 * fVar96 + fVar161;
  fVar75 = fVar97 * fVar97 + 0.0;
  fVar76 = fVar179 * fVar179 + 0.0;
  fVar77 = fVar180 * fVar180 + 0.0;
  auVar24._4_4_ = local_2c0 * fVar172;
  auVar24._0_4_ = local_2c0 * fVar167;
  auVar24._8_4_ = local_2c0 * fVar173;
  auVar24._12_4_ = local_2c0 * fVar174;
  auVar24._16_4_ = local_2c0 * fVar175;
  auVar24._20_4_ = local_2c0 * fVar176;
  auVar24._24_4_ = local_2c0 * fVar177;
  auVar24._28_4_ = fVar23;
  auVar90 = vfmadd231ps_fma(auVar24,_local_1c0,_local_500);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),_local_520,_local_4e0);
  fVar183 = fVar156 * fVar156;
  fVar186 = fVar158 * fVar158;
  fVar187 = fVar160 * fVar160;
  fVar188 = fVar161 * fVar161;
  uStack_1c4 = fStack_e4;
  _local_1e0 = ZEXT1628(CONCAT412(fVar188,CONCAT48(fVar187,CONCAT44(fVar186,fVar183))));
  fVar78 = auVar79._0_4_;
  fVar146 = auVar89._0_4_;
  fVar85 = auVar79._4_4_;
  fVar155 = auVar89._4_4_;
  fVar86 = auVar79._8_4_;
  fVar157 = auVar89._8_4_;
  fVar87 = auVar79._12_4_;
  fVar159 = auVar89._12_4_;
  auVar25._4_4_ = fVar72 * fVar155 * fVar85;
  auVar25._0_4_ = fVar63 * fVar146 * fVar78;
  auVar25._8_4_ = fVar73 * fVar157 * fVar86;
  auVar25._12_4_ = fVar74 * fVar159 * fVar87;
  auVar25._16_4_ = fVar75 * 0.0;
  auVar25._20_4_ = fVar76 * 0.0;
  auVar25._24_4_ = fVar77 * 0.0;
  auVar25._28_4_ = auVar99._28_4_;
  auVar102 = vsubps_avx(ZEXT1632(CONCAT412(fVar188 * auVar90._12_4_,
                                           CONCAT48(fVar187 * auVar90._8_4_,
                                                    CONCAT44(fVar186 * auVar90._4_4_,
                                                             fVar183 * auVar90._0_4_)))),auVar25);
  auVar109 = ZEXT1632(auVar64);
  fVar112 = auVar165._0_4_;
  fVar98 = fVar112 * fVar156;
  fVar119 = auVar165._4_4_;
  fVar103 = fVar119 * fVar158;
  auVar26._4_4_ = fVar103;
  auVar26._0_4_ = fVar98;
  fVar121 = auVar165._8_4_;
  fVar104 = fVar121 * fVar160;
  auVar26._8_4_ = fVar104;
  fVar123 = auVar165._12_4_;
  fVar105 = fVar123 * fVar161;
  auVar26._12_4_ = fVar105;
  fVar124 = auVar165._16_4_;
  fVar106 = fVar124 * 0.0;
  auVar26._16_4_ = fVar106;
  fVar125 = auVar165._20_4_;
  fVar107 = fVar125 * 0.0;
  auVar26._20_4_ = fVar107;
  fVar126 = auVar165._24_4_;
  fVar181 = auVar165._28_4_;
  fVar108 = fVar126 * 0.0;
  auVar26._24_4_ = fVar108;
  auVar26._28_4_ = fVar181;
  auVar92._0_4_ = fVar98 * fVar146 * fVar163 + auVar102._0_4_;
  auVar92._4_4_ = fVar103 * fVar155 * fVar88 + auVar102._4_4_;
  auVar92._8_4_ = fVar104 * fVar157 * fVar95 + auVar102._8_4_;
  auVar92._12_4_ = fVar105 * fVar159 * fVar96 + auVar102._12_4_;
  auVar92._16_4_ = fVar106 * fVar97 * 0.0 + auVar102._16_4_;
  auVar92._20_4_ = fVar107 * fVar179 * 0.0 + auVar102._20_4_;
  auVar92._24_4_ = fVar108 * fVar180 * 0.0 + auVar102._24_4_;
  auVar92._28_4_ = auVar99._28_4_ + auVar102._28_4_;
  auVar165._4_4_ = fVar172 * fVar172;
  auVar165._0_4_ = fVar167 * fVar167;
  auVar165._8_4_ = fVar173 * fVar173;
  auVar165._12_4_ = fVar174 * fVar174;
  auVar165._16_4_ = fVar175 * fVar175;
  auVar165._20_4_ = fVar176 * fVar176;
  auVar165._24_4_ = fVar177 * fVar177;
  auVar165._28_4_ = auVar102._28_4_;
  auVar64 = vfmadd231ps_fma(auVar165,_local_500,_local_500);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),_local_4e0,_local_4e0);
  auVar27._4_4_ = fVar72 * fVar85 * fVar85;
  auVar27._0_4_ = fVar63 * fVar78 * fVar78;
  auVar27._8_4_ = fVar73 * fVar86 * fVar86;
  auVar27._12_4_ = fVar74 * fVar87 * fVar87;
  auVar27._16_4_ = fVar75 * 0.0;
  auVar27._20_4_ = fVar76 * 0.0;
  auVar27._24_4_ = fVar77 * 0.0;
  auVar27._28_4_ = local_460._28_4_;
  auVar102 = vsubps_avx(ZEXT1632(CONCAT412(fVar188 * auVar64._12_4_,
                                           CONCAT48(fVar187 * auVar64._8_4_,
                                                    CONCAT44(fVar186 * auVar64._4_4_,
                                                             fVar183 * auVar64._0_4_)))),auVar27);
  fStack_304 = auVar141._28_4_;
  auVar28._4_4_ = fVar85 * (fVar88 + fVar88);
  auVar28._0_4_ = fVar78 * (fVar163 + fVar163);
  auVar28._8_4_ = fVar86 * (fVar95 + fVar95);
  auVar28._12_4_ = fVar87 * (fVar96 + fVar96);
  auVar28._16_4_ = (fVar97 + fVar97) * 0.0;
  auVar28._20_4_ = (fVar179 + fVar179) * 0.0;
  auVar28._24_4_ = (fVar180 + fVar180) * 0.0;
  auVar28._28_4_ = fStack_304 + fStack_304;
  auVar141 = vsubps_avx(auVar28,auVar26);
  fVar127 = fVar146 * fVar146;
  fVar133 = fVar155 * fVar155;
  fVar134 = fVar157 * fVar157;
  fVar135 = fVar159 * fVar159;
  auVar29._4_4_ = fVar72 * fVar133;
  auVar29._0_4_ = fVar63 * fVar127;
  auVar29._8_4_ = fVar73 * fVar134;
  auVar29._12_4_ = fVar74 * fVar135;
  auVar29._16_4_ = fVar75 * 0.0;
  auVar29._20_4_ = fVar76 * 0.0;
  auVar29._24_4_ = fVar77 * 0.0;
  auVar29._28_4_ = auVar102._28_4_;
  auVar153 = vsubps_avx(_local_1e0,auVar29);
  auVar30._4_4_ = auVar153._4_4_ * (auVar102._4_4_ + fVar103 * auVar141._4_4_);
  auVar30._0_4_ = auVar153._0_4_ * (auVar102._0_4_ + fVar98 * auVar141._0_4_);
  auVar30._8_4_ = auVar153._8_4_ * (auVar102._8_4_ + fVar104 * auVar141._8_4_);
  auVar30._12_4_ = auVar153._12_4_ * (auVar102._12_4_ + fVar105 * auVar141._12_4_);
  auVar30._16_4_ = auVar153._16_4_ * (auVar102._16_4_ + fVar106 * auVar141._16_4_);
  auVar30._20_4_ = auVar153._20_4_ * (auVar102._20_4_ + fVar107 * auVar141._20_4_);
  auVar30._24_4_ = auVar153._24_4_ * (auVar102._24_4_ + fVar108 * auVar141._24_4_);
  auVar30._28_4_ = auVar102._28_4_ + fVar181;
  auVar31._4_4_ = auVar92._4_4_ * auVar92._4_4_;
  auVar31._0_4_ = auVar92._0_4_ * auVar92._0_4_;
  auVar31._8_4_ = auVar92._8_4_ * auVar92._8_4_;
  auVar31._12_4_ = auVar92._12_4_ * auVar92._12_4_;
  auVar31._16_4_ = auVar92._16_4_ * auVar92._16_4_;
  auVar31._20_4_ = auVar92._20_4_ * auVar92._20_4_;
  auVar31._24_4_ = auVar92._24_4_ * auVar92._24_4_;
  auVar31._28_4_ = auVar141._28_4_;
  auVar102 = vsubps_avx(auVar31,auVar30);
  auVar115 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar141 = vcmpps_avx(auVar102,auVar115,5);
  auVar165 = auVar141 & ~auVar65;
  if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar165 >> 0x7f,0) != '\0') ||
        (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar165 >> 0xbf,0) != '\0') ||
      (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar165[0x1f] < '\0')
  {
    auVar141 = vandnps_avx(auVar65,auVar141);
    auVar64 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
    auVar65 = vsubps_avx(auVar67,auVar113);
    auVar91 = vsubps_avx(auVar130,auVar91);
    uStack_310 = 0;
    uStack_30c = 0;
    uStack_308 = 0;
    auVar99 = vsubps_avx(auVar149,auVar99);
    auVar137._2_2_ = 0;
    auVar137._0_2_ = uVar3;
    auVar137._4_2_ = uVar3;
    auVar137._6_2_ = 0;
    auVar137._8_2_ = uVar3;
    auVar137._10_2_ = 0;
    auVar137._12_2_ = uVar3;
    auVar137._14_2_ = 0;
    auVar137._16_2_ = uVar3;
    auVar137._18_2_ = 0;
    auVar137._20_2_ = uVar3;
    auVar137._22_2_ = 0;
    auVar137._24_2_ = uVar3;
    auVar137._26_2_ = 0;
    auVar137._28_2_ = uVar3;
    auVar137._30_2_ = 0;
    auVar165 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar141 = vpand_avx2(auVar165,auVar137);
    auVar141 = vpcmpeqd_avx2(auVar141,auVar115);
    auVar79 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
    auVar138._2_2_ = 0;
    auVar138._0_2_ = uVar2;
    auVar138._4_2_ = uVar2;
    auVar138._6_2_ = 0;
    auVar138._8_2_ = uVar2;
    auVar138._10_2_ = 0;
    auVar138._12_2_ = uVar2;
    auVar138._14_2_ = 0;
    auVar138._16_2_ = uVar2;
    auVar138._18_2_ = 0;
    auVar138._20_2_ = uVar2;
    auVar138._22_2_ = 0;
    auVar138._24_2_ = uVar2;
    auVar138._26_2_ = 0;
    auVar138._28_2_ = uVar2;
    auVar138._30_2_ = 0;
    auVar102 = vsqrtps_avx(auVar102);
    auVar115 = vpand_avx2(auVar165,auVar138);
    auVar141 = vrcpps_avx(auVar153);
    auVar68._8_4_ = 0x3f800000;
    auVar68._0_8_ = 0x3f8000003f800000;
    auVar68._12_4_ = 0x3f800000;
    auVar68._16_4_ = 0x3f800000;
    auVar68._20_4_ = 0x3f800000;
    auVar68._24_4_ = 0x3f800000;
    auVar68._28_4_ = 0x3f800000;
    auVar90 = vfnmadd213ps_fma(auVar141,auVar153,auVar68);
    auVar69._8_4_ = 0x7fffffff;
    auVar69._0_8_ = 0x7fffffff7fffffff;
    auVar69._12_4_ = 0x7fffffff;
    auVar69._16_4_ = 0x7fffffff;
    auVar69._20_4_ = 0x7fffffff;
    auVar69._24_4_ = 0x7fffffff;
    auVar69._28_4_ = 0x7fffffff;
    auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar141,auVar141);
    auVar141 = vandps_avx(auVar153,auVar69);
    auVar81._8_4_ = 0x219392ef;
    auVar81._0_8_ = 0x219392ef219392ef;
    auVar81._12_4_ = 0x219392ef;
    auVar81._16_4_ = 0x219392ef;
    auVar81._20_4_ = 0x219392ef;
    auVar81._24_4_ = 0x219392ef;
    auVar81._28_4_ = 0x219392ef;
    auVar141 = vcmpps_avx(auVar141,auVar81,2);
    uVar62 = CONCAT44(auVar92._4_4_,auVar92._0_4_);
    auVar82._0_8_ = uVar62 ^ 0x8000000080000000;
    auVar82._8_4_ = -auVar92._8_4_;
    auVar82._12_4_ = -auVar92._12_4_;
    auVar82._16_4_ = -auVar92._16_4_;
    auVar82._20_4_ = -auVar92._20_4_;
    auVar82._24_4_ = -auVar92._24_4_;
    auVar82._28_4_ = -auVar92._28_4_;
    auVar153 = vsubps_avx(auVar82,auVar102);
    auVar102 = vsubps_avx(auVar102,auVar92);
    auVar32._4_4_ = auVar90._4_4_ * auVar153._4_4_;
    auVar32._0_4_ = auVar90._0_4_ * auVar153._0_4_;
    auVar32._8_4_ = auVar90._8_4_ * auVar153._8_4_;
    auVar32._12_4_ = auVar90._12_4_ * auVar153._12_4_;
    auVar32._16_4_ = auVar153._16_4_ * 0.0;
    auVar32._20_4_ = auVar153._20_4_ * 0.0;
    auVar32._24_4_ = auVar153._24_4_ * 0.0;
    auVar32._28_4_ = auVar153._28_4_;
    auVar169._0_4_ = auVar90._0_4_ * auVar102._0_4_;
    auVar169._4_4_ = auVar90._4_4_ * auVar102._4_4_;
    auVar169._8_4_ = auVar90._8_4_ * auVar102._8_4_;
    auVar169._12_4_ = auVar90._12_4_ * auVar102._12_4_;
    auVar169._16_4_ = auVar102._16_4_ * 0.0;
    auVar169._20_4_ = auVar102._20_4_ * 0.0;
    auVar169._24_4_ = auVar102._24_4_ * 0.0;
    auVar169._28_4_ = 0;
    auVar93._8_4_ = 0xff800000;
    auVar93._0_8_ = 0xff800000ff800000;
    auVar93._12_4_ = 0xff800000;
    auVar93._16_4_ = 0xff800000;
    auVar93._20_4_ = 0xff800000;
    auVar93._24_4_ = 0xff800000;
    auVar93._28_4_ = 0xff800000;
    auVar102 = vblendvps_avx(auVar32,auVar93,auVar141);
    auVar94._8_4_ = 0x7f800000;
    auVar94._0_8_ = 0x7f8000007f800000;
    auVar94._12_4_ = 0x7f800000;
    auVar94._16_4_ = 0x7f800000;
    auVar94._20_4_ = 0x7f800000;
    auVar94._24_4_ = 0x7f800000;
    auVar94._28_4_ = 0x7f800000;
    auVar153 = vblendvps_avx(auVar169,auVar94,auVar141);
    auVar168._0_4_ = fVar78 + fVar146 * auVar102._0_4_;
    auVar168._4_4_ = fVar85 + fVar155 * auVar102._4_4_;
    auVar168._8_4_ = fVar86 + fVar157 * auVar102._8_4_;
    auVar168._12_4_ = fVar87 + fVar159 * auVar102._12_4_;
    auVar168._16_4_ = auVar102._16_4_ * 0.0 + 0.0;
    auVar168._20_4_ = auVar102._20_4_ * 0.0 + 0.0;
    auVar168._24_4_ = auVar102._24_4_ * 0.0 + 0.0;
    auVar170._28_4_ = 0;
    auVar170._0_28_ = auVar168;
    auVar116 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar141 = vcmpps_avx(auVar170,auVar116,6);
    auVar165 = vcmpps_avx(auVar170,auVar109,1);
    auVar141 = vandps_avx(auVar165,auVar141);
    auVar90 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
    auVar90 = vpand_avx(auVar90,auVar64);
    auVar113 = vpmovsxwd_avx2(auVar90);
    local_540 = vblendvps_avx(auVar94,auVar102,auVar113);
    auVar165 = vpcmpeqd_avx2(auVar115,auVar116);
    local_80._0_4_ = fVar78 + fVar146 * auVar153._0_4_;
    local_80._4_4_ = fVar85 + fVar155 * auVar153._4_4_;
    local_80._8_4_ = fVar86 + fVar157 * auVar153._8_4_;
    local_80._12_4_ = fVar87 + fVar159 * auVar153._12_4_;
    local_80._16_4_ = auVar153._16_4_ * 0.0 + 0.0;
    local_80._20_4_ = auVar153._20_4_ * 0.0 + 0.0;
    local_80._24_4_ = auVar153._24_4_ * 0.0 + 0.0;
    local_80._28_4_ = auVar115._28_4_ + 0.0;
    auVar141 = vcmpps_avx(local_80,auVar116,6);
    auVar102 = vcmpps_avx(local_80,auVar109,1);
    auVar141 = vandps_avx(auVar102,auVar141);
    auVar90 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
    auVar90 = vpand_avx(auVar64,auVar90);
    auVar141 = vpmovsxwd_avx2(auVar90);
    local_4a0 = vblendvps_avx(auVar93,auVar153,auVar141);
    auVar90 = vpackssdw_avx(auVar165._0_16_,auVar165._16_16_);
    auVar141 = vrcpps_avx(ZEXT1632(auVar89));
    auVar100._8_4_ = 0x3f800000;
    auVar100._0_8_ = 0x3f8000003f800000;
    auVar100._12_4_ = 0x3f800000;
    auVar100._16_4_ = 0x3f800000;
    auVar100._20_4_ = 0x3f800000;
    auVar100._24_4_ = 0x3f800000;
    auVar100._28_4_ = 0x3f800000;
    auVar89 = vfnmadd213ps_fma(auVar141,ZEXT1632(auVar89),auVar100);
    auVar80 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar141,auVar141);
    auVar33._4_4_ = fVar155 * (float)local_4e0._4_4_;
    auVar33._0_4_ = fVar146 * (float)local_4e0._0_4_;
    auVar33._8_4_ = fVar157 * fStack_4d8;
    auVar33._12_4_ = fVar159 * fStack_4d4;
    auVar33._16_4_ = fStack_4d0 * 0.0;
    auVar33._20_4_ = fStack_4cc * 0.0;
    auVar33._24_4_ = fStack_4c8 * 0.0;
    auVar33._28_4_ = auVar141._28_4_;
    auVar34._4_4_ = fVar85 * fVar147;
    auVar34._0_4_ = fVar78 * fVar147;
    auVar34._8_4_ = fVar86 * fVar147;
    auVar34._12_4_ = fVar87 * fVar147;
    auVar34._16_4_ = fVar147 * 0.0;
    auVar34._20_4_ = fVar147 * 0.0;
    auVar34._24_4_ = fVar147 * 0.0;
    auVar34._28_4_ = 0x3f800000;
    auVar141 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = fVar155 * (float)local_500._4_4_;
    auVar35._0_4_ = fVar146 * (float)local_500._0_4_;
    auVar35._8_4_ = fVar157 * fStack_4f8;
    auVar35._12_4_ = fVar159 * fStack_4f4;
    auVar35._16_4_ = fStack_4f0 * 0.0;
    auVar35._20_4_ = fStack_4ec * 0.0;
    auVar35._24_4_ = fStack_4e8 * 0.0;
    auVar35._28_4_ = 0x3f800000;
    auVar36._4_4_ = fStack_e4 * fVar85;
    auVar36._0_4_ = fStack_e4 * fVar78;
    auVar36._8_4_ = fStack_e4 * fVar86;
    auVar36._12_4_ = fStack_e4 * fVar87;
    auVar36._16_4_ = fStack_e4 * 0.0;
    auVar36._20_4_ = fStack_e4 * 0.0;
    auVar36._24_4_ = fStack_e4 * 0.0;
    auVar36._28_4_ = auVar113._28_4_;
    auVar102 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = fVar155 * fVar172;
    auVar37._0_4_ = fVar146 * fVar167;
    auVar37._8_4_ = fVar157 * fVar173;
    auVar37._12_4_ = fVar159 * fVar174;
    auVar37._16_4_ = fVar175 * 0.0;
    auVar37._20_4_ = fVar176 * 0.0;
    auVar37._24_4_ = fVar177 * 0.0;
    auVar37._28_4_ = auVar113._28_4_;
    auVar182._0_4_ = local_2c0 * fVar78;
    auVar182._4_4_ = local_2c0 * fVar85;
    auVar182._8_4_ = local_2c0 * fVar86;
    auVar182._12_4_ = local_2c0 * fVar87;
    auVar182._16_4_ = local_2c0 * 0.0;
    auVar182._20_4_ = local_2c0 * 0.0;
    auVar182._24_4_ = local_2c0 * 0.0;
    auVar182._28_4_ = 0;
    auVar153 = vsubps_avx(auVar37,auVar182);
    auVar38._4_4_ = auVar153._4_4_ * auVar153._4_4_;
    auVar38._0_4_ = auVar153._0_4_ * auVar153._0_4_;
    auVar38._8_4_ = auVar153._8_4_ * auVar153._8_4_;
    auVar38._12_4_ = auVar153._12_4_ * auVar153._12_4_;
    auVar38._16_4_ = auVar153._16_4_ * auVar153._16_4_;
    auVar38._20_4_ = auVar153._20_4_ * auVar153._20_4_;
    auVar38._24_4_ = auVar153._24_4_ * auVar153._24_4_;
    auVar38._28_4_ = auVar153._28_4_;
    auVar89 = vfmadd231ps_fma(auVar38,auVar102,auVar102);
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar141,auVar141);
    auVar39._4_4_ = fVar133 * fVar119 * fVar119;
    auVar39._0_4_ = fVar127 * fVar112 * fVar112;
    auVar39._8_4_ = fVar134 * fVar121 * fVar121;
    auVar39._12_4_ = fVar135 * fVar123 * fVar123;
    auVar39._16_4_ = fVar124 * fVar124 * 0.0;
    auVar39._20_4_ = fVar125 * fVar125 * 0.0;
    auVar39._24_4_ = fVar126 * fVar126 * 0.0;
    auVar39._28_4_ = fVar181;
    auVar141 = vcmpps_avx(ZEXT1632(auVar89),auVar39,1);
    auVar89 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
    auVar89 = vpand_avx(auVar90,auVar89);
    auVar40._4_4_ = auVar80._4_4_ * -fVar85;
    auVar40._0_4_ = auVar80._0_4_ * -fVar78;
    auVar40._8_4_ = auVar80._8_4_ * -fVar86;
    auVar40._12_4_ = auVar80._12_4_ * -fVar87;
    auVar40._16_4_ = 0x80000000;
    auVar40._20_4_ = 0x80000000;
    auVar40._24_4_ = 0x80000000;
    auVar40._28_4_ = 0x80000000;
    auVar89 = vpand_avx(auVar64,auVar89);
    auVar141 = vpmovsxwd_avx2(auVar89);
    local_4c0 = vblendvps_avx(auVar94,auVar40,auVar141);
    auVar41._4_4_ = auVar99._4_4_ * fVar15;
    auVar41._0_4_ = auVar99._0_4_ * fVar162;
    auVar41._8_4_ = auVar99._8_4_ * fVar16;
    auVar41._12_4_ = auVar99._12_4_ * fVar17;
    auVar41._16_4_ = auVar99._16_4_ * fVar18;
    auVar41._20_4_ = auVar99._20_4_ * fVar19;
    auVar41._24_4_ = auVar99._24_4_ * fVar20;
    auVar41._28_4_ = 0x80000000;
    auVar89 = vfmadd231ps_fma(auVar41,auVar91,local_460);
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar65,local_440);
    auVar42._4_4_ = fVar155 * auVar65._4_4_;
    auVar42._0_4_ = fVar146 * auVar65._0_4_;
    auVar42._8_4_ = fVar157 * auVar65._8_4_;
    auVar42._12_4_ = fVar159 * auVar65._12_4_;
    auVar42._16_4_ = auVar65._16_4_ * 0.0;
    auVar42._20_4_ = auVar65._20_4_ * 0.0;
    auVar42._24_4_ = auVar65._24_4_ * 0.0;
    auVar42._28_4_ = auVar65._28_4_;
    auVar43._4_4_ = fVar155 * auVar91._4_4_;
    auVar43._0_4_ = fVar146 * auVar91._0_4_;
    auVar43._8_4_ = fVar157 * auVar91._8_4_;
    auVar43._12_4_ = fVar159 * auVar91._12_4_;
    auVar43._16_4_ = auVar91._16_4_ * 0.0;
    auVar43._20_4_ = auVar91._20_4_ * 0.0;
    auVar43._24_4_ = auVar91._24_4_ * 0.0;
    auVar43._28_4_ = auVar91._28_4_;
    auVar44._4_4_ = fVar155 * auVar99._4_4_;
    auVar44._0_4_ = fVar146 * auVar99._0_4_;
    auVar44._8_4_ = fVar157 * auVar99._8_4_;
    auVar44._12_4_ = fVar159 * auVar99._12_4_;
    auVar44._16_4_ = auVar99._16_4_ * 0.0;
    auVar44._20_4_ = auVar99._20_4_ * 0.0;
    auVar44._24_4_ = auVar99._24_4_ * 0.0;
    auVar44._28_4_ = auVar99._28_4_;
    fVar78 = auVar89._0_4_;
    auVar150._0_4_ = fVar78 * fVar147;
    fVar85 = auVar89._4_4_;
    auVar150._4_4_ = fVar85 * fVar147;
    fVar86 = auVar89._8_4_;
    auVar150._8_4_ = fVar86 * fVar147;
    fVar87 = auVar89._12_4_;
    auVar150._12_4_ = fVar87 * fVar147;
    auVar150._16_4_ = fVar147 * 0.0;
    auVar150._20_4_ = fVar147 * 0.0;
    auVar150._24_4_ = fVar147 * 0.0;
    auVar150._28_4_ = 0;
    auVar141 = vsubps_avx(auVar42,auVar150);
    auVar45._4_4_ = fStack_e4 * fVar85;
    auVar45._0_4_ = fStack_e4 * fVar78;
    auVar45._8_4_ = fStack_e4 * fVar86;
    auVar45._12_4_ = fStack_e4 * fVar87;
    auVar45._16_4_ = fStack_e4 * 0.0;
    auVar45._20_4_ = fStack_e4 * 0.0;
    auVar45._24_4_ = fStack_e4 * 0.0;
    auVar45._28_4_ = 0;
    auVar102 = vsubps_avx(auVar43,auVar45);
    auVar46._4_4_ = local_2c0 * fVar85;
    auVar46._0_4_ = local_2c0 * fVar78;
    auVar46._8_4_ = local_2c0 * fVar86;
    auVar46._12_4_ = local_2c0 * fVar87;
    auVar46._16_4_ = local_2c0 * 0.0;
    auVar46._20_4_ = local_2c0 * 0.0;
    auVar46._24_4_ = local_2c0 * 0.0;
    auVar46._28_4_ = 0;
    auVar153 = vsubps_avx(auVar44,auVar46);
    auVar47._4_4_ = auVar153._4_4_ * auVar153._4_4_;
    auVar47._0_4_ = auVar153._0_4_ * auVar153._0_4_;
    auVar47._8_4_ = auVar153._8_4_ * auVar153._8_4_;
    auVar47._12_4_ = auVar153._12_4_ * auVar153._12_4_;
    auVar47._16_4_ = auVar153._16_4_ * auVar153._16_4_;
    auVar47._20_4_ = auVar153._20_4_ * auVar153._20_4_;
    auVar47._24_4_ = auVar153._24_4_ * auVar153._24_4_;
    auVar47._28_4_ = auVar153._28_4_;
    auVar89 = vfmadd231ps_fma(auVar47,auVar102,auVar102);
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar141,auVar141);
    local_560._0_4_ = auVar84._0_4_;
    local_560._4_4_ = auVar84._4_4_;
    fStack_558 = auVar84._8_4_;
    fStack_554 = auVar84._12_4_;
    fStack_550 = auVar84._16_4_;
    fStack_54c = auVar84._20_4_;
    fStack_548 = auVar84._24_4_;
    auVar48._4_4_ = fVar133 * (float)local_560._4_4_ * (float)local_560._4_4_;
    auVar48._0_4_ = fVar127 * (float)local_560._0_4_ * (float)local_560._0_4_;
    auVar48._8_4_ = fVar134 * fStack_558 * fStack_558;
    auVar48._12_4_ = fVar135 * fStack_554 * fStack_554;
    auVar48._16_4_ = fStack_550 * fStack_550 * 0.0;
    auVar48._20_4_ = fStack_54c * fStack_54c * 0.0;
    auVar48._24_4_ = fStack_548 * fStack_548 * 0.0;
    auVar48._28_4_ = auVar102._28_4_;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar70._4_4_ = uVar1;
    auVar70._0_4_ = uVar1;
    auVar70._8_4_ = uVar1;
    auVar70._12_4_ = uVar1;
    auVar70._16_4_ = uVar1;
    auVar70._20_4_ = uVar1;
    auVar70._24_4_ = uVar1;
    auVar70._28_4_ = uVar1;
    auVar141 = vcmpps_avx(ZEXT1632(auVar89),auVar48,1);
    auVar89 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
    auVar79 = vpand_avx(auVar89,auVar79);
    auVar49._4_4_ = auVar80._4_4_ * -fVar85;
    auVar49._0_4_ = auVar80._0_4_ * -fVar78;
    auVar49._8_4_ = auVar80._8_4_ * -fVar86;
    auVar49._12_4_ = auVar80._12_4_ * -fVar87;
    auVar49._16_4_ = 0x80000000;
    auVar49._20_4_ = 0x80000000;
    auVar49._24_4_ = 0x80000000;
    auVar49._28_4_ = 0x80000000;
    auVar79 = vpand_avx(auVar64,auVar79);
    auVar141 = vpmovsxwd_avx2(auVar79);
    auVar141 = vblendvps_avx(auVar94,auVar49,auVar141);
    auVar165 = vminps_avx(local_4c0,auVar141);
    auVar102 = vmaxps_avx(local_4c0,auVar141);
    auVar115 = vminps_avx(local_540,auVar165);
    auVar153 = vcmpps_avx(auVar115,auVar165,0);
    auVar141 = vcmpps_avx(auVar102,auVar94,0);
    auVar139._8_4_ = 0xff800000;
    auVar139._0_8_ = 0xff800000ff800000;
    auVar139._12_4_ = 0xff800000;
    auVar139._16_4_ = 0xff800000;
    auVar139._20_4_ = 0xff800000;
    auVar139._24_4_ = 0xff800000;
    auVar139._28_4_ = 0xff800000;
    auVar141 = vblendvps_avx(auVar102,auVar139,auVar141);
    auVar102 = vcmpps_avx(auVar165,auVar94,0);
    auVar102 = vblendvps_avx(auVar165,auVar139,auVar102);
    auVar141 = vblendvps_avx(auVar102,auVar141,auVar153);
    local_a0 = vmaxps_avx(local_4a0,auVar141);
    auVar101._0_4_ = fVar111 + auVar115._0_4_;
    auVar101._4_4_ = fVar118 + auVar115._4_4_;
    auVar101._8_4_ = fVar120 + auVar115._8_4_;
    auVar101._12_4_ = fVar122 + auVar115._12_4_;
    auVar101._16_4_ = auVar115._16_4_ + 0.0;
    auVar101._20_4_ = auVar115._20_4_ + 0.0;
    auVar101._24_4_ = auVar115._24_4_ + 0.0;
    auVar101._28_4_ = auVar115._28_4_ + 0.0;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    local_560._4_4_ = uVar1;
    local_560._0_4_ = uVar1;
    fStack_558 = (float)uVar1;
    fStack_554 = (float)uVar1;
    fStack_550 = (float)uVar1;
    fStack_54c = (float)uVar1;
    fStack_548 = (float)uVar1;
    register0x0000139c = uVar1;
    auVar141 = vcmpps_avx(auVar70,auVar101,2);
    auVar102 = vcmpps_avx(auVar101,_local_560,2);
    auVar141 = vandps_avx(auVar141,auVar102);
    auVar102 = vcmpps_avx(auVar115,auVar94,4);
    auVar141 = vandps_avx(auVar141,auVar102);
    auVar79 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
    local_5a0 = vpand_avx(auVar64,auVar79);
    local_580._0_4_ = fVar111 + local_a0._0_4_;
    local_580._4_4_ = fVar118 + local_a0._4_4_;
    local_580._8_4_ = fVar120 + local_a0._8_4_;
    local_580._12_4_ = fVar122 + local_a0._12_4_;
    local_580._16_4_ = local_a0._16_4_ + 0.0;
    local_580._20_4_ = local_a0._20_4_ + 0.0;
    local_580._24_4_ = local_a0._24_4_ + 0.0;
    fStack_2e4 = local_a0._28_4_;
    local_580._28_4_ = fStack_2e4 + 0.0;
    auVar141 = vcmpps_avx(auVar70,local_580,2);
    auVar102 = vcmpps_avx(local_580,_local_560,2);
    auVar141 = vandps_avx(auVar141,auVar102);
    auVar102 = vcmpps_avx(local_a0,auVar139,4);
    auVar141 = vandps_avx(auVar141,auVar102);
    auVar79 = vpackssdw_avx(auVar141._0_16_,auVar141._16_16_);
    local_320 = vpand_avx(auVar64,auVar79);
    local_340._0_16_ = vpor_avx(local_5a0,local_320);
    auVar141 = vpmovsxwd_avx2(local_340._0_16_);
    if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar141 >> 0x7f,0) != '\0') ||
          (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar141 >> 0xbf,0) != '\0') ||
        (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar141[0x1f] < '\0') {
      auStack_590 = auVar65._16_16_;
      auVar141 = vpmovzxwd_avx2(local_5a0);
      auVar102 = vpslld_avx2(auVar141,0x1f);
      auVar141 = vblendvps_avx(local_a0,auVar115,auVar102);
      auVar115 = vrcpps_avx(auVar109);
      auVar102 = vblendvps_avx(local_80,auVar170,auVar102);
      auVar132 = ZEXT3264(auVar102);
      local_340._16_12_ = auVar168._16_12_;
      local_340._28_4_ = 0;
      auVar184._8_4_ = 0x3f800000;
      auVar184._0_8_ = 0x3f8000003f800000;
      auVar184._12_4_ = 0x3f800000;
      auVar184._16_4_ = 0x3f800000;
      auVar184._20_4_ = 0x3f800000;
      auVar184._24_4_ = 0x3f800000;
      auVar184._28_4_ = 0x3f800000;
      auVar90 = vfnmadd213ps_fma(auVar115,auVar109,auVar184);
      fVar112 = fVar156 * fVar163 * fVar112;
      fVar119 = fVar158 * fVar88 * fVar119;
      fVar121 = fVar160 * fVar95 * fVar121;
      fVar123 = fVar161 * fVar96 * fVar123;
      fVar124 = fVar97 * 0.0 * fVar124;
      fVar125 = fVar179 * 0.0 * fVar125;
      fVar126 = fVar180 * 0.0 * fVar126;
      local_300 = local_440._0_4_ * fVar112;
      fStack_2fc = local_440._4_4_ * fVar119;
      fVar179 = local_440._8_4_;
      fVar180 = local_440._12_4_;
      fVar181 = local_440._16_4_;
      fVar98 = local_440._20_4_;
      fVar103 = local_440._24_4_;
      local_c0 = local_440._0_4_ * fVar63;
      fStack_bc = local_440._4_4_ * fVar72;
      auVar153 = vcmpps_avx(auVar141,local_540,0);
      auVar165 = vcmpps_avx(local_4a0,auVar141,0);
      auVar153 = vorps_avx(auVar153,auVar165);
      auVar79 = vpackssdw_avx(auVar153._0_16_,auVar153._16_16_);
      auVar89 = vpand_avx(auVar64,auVar79);
      auVar153 = vcmpps_avx(local_4c0,auVar141,0);
      auVar79 = vpackssdw_avx(auVar153._0_16_,auVar153._16_16_);
      auVar64 = vpand_avx(auVar64,auVar79);
      fVar88 = auVar141._0_4_;
      fVar85 = auVar141._4_4_;
      fVar95 = auVar141._8_4_;
      fVar86 = auVar141._12_4_;
      fVar96 = auVar141._16_4_;
      fVar87 = auVar141._20_4_;
      fVar97 = auVar141._24_4_;
      fStack_2f8 = fVar179 * fVar121;
      fStack_2f4 = fVar180 * fVar123;
      fStack_2f0 = fVar181 * fVar124;
      fStack_2ec = fVar98 * fVar125;
      fStack_2e8 = fVar103 * fVar126;
      auVar144._0_4_ = local_300 + fVar183 * (fVar88 * fVar147 + (float)local_4e0._0_4_);
      auVar144._4_4_ = fStack_2fc + fVar186 * (fVar85 * fVar147 + (float)local_4e0._4_4_);
      auVar144._8_4_ = fVar179 * fVar121 + fVar187 * (fVar95 * fVar147 + fStack_4d8);
      auVar144._12_4_ = fVar180 * fVar123 + fVar188 * (fVar86 * fVar147 + fStack_4d4);
      auVar144._16_4_ = fVar181 * fVar124 + (fVar96 * fVar147 + fStack_4d0) * 0.0;
      auVar144._20_4_ = fVar98 * fVar125 + (fVar87 * fVar147 + fStack_4cc) * 0.0;
      auVar144._24_4_ = fVar103 * fVar126 + (fVar97 * fVar147 + fStack_4c8) * 0.0;
      auVar144._28_4_ = fStack_2e4 + fStack_4c4 + 0.0;
      fStack_b8 = fVar179 * fVar73;
      fStack_b4 = fVar180 * fVar74;
      fStack_b0 = fVar181 * fVar75;
      fStack_ac = fVar98 * fVar76;
      fStack_a8 = fVar103 * fVar77;
      uStack_a4 = 0x3f800000;
      fVar147 = auVar102._0_4_;
      auVar151._0_4_ = local_c0 * fVar147;
      fVar156 = auVar102._4_4_;
      auVar151._4_4_ = fStack_bc * fVar156;
      fVar158 = auVar102._8_4_;
      auVar151._8_4_ = fVar179 * fVar73 * fVar158;
      fVar160 = auVar102._12_4_;
      auVar151._12_4_ = fVar180 * fVar74 * fVar160;
      fVar161 = auVar102._16_4_;
      auVar151._16_4_ = fVar181 * fVar75 * fVar161;
      fVar163 = auVar102._20_4_;
      auVar151._20_4_ = fVar98 * fVar76 * fVar163;
      fVar78 = auVar102._24_4_;
      auVar151._24_4_ = fVar103 * fVar77 * fVar78;
      auVar151._28_4_ = 0;
      auVar153 = vsubps_avx(auVar144,auVar151);
      local_100 = local_460._0_4_ * fVar112;
      fStack_fc = local_460._4_4_ * fVar119;
      fVar104 = local_460._8_4_;
      fVar105 = local_460._12_4_;
      fVar106 = local_460._16_4_;
      fVar107 = local_460._20_4_;
      fVar108 = local_460._24_4_;
      fStack_f8 = fVar104 * fVar121;
      fStack_f4 = fVar105 * fVar123;
      fStack_f0 = fVar106 * fVar124;
      fStack_ec = fVar107 * fVar125;
      fStack_e8 = fVar108 * fVar126;
      auVar152._0_4_ = fVar183 * (fStack_e4 * fVar88 + (float)local_500._0_4_) + local_100;
      auVar152._4_4_ = fVar186 * (fStack_e4 * fVar85 + (float)local_500._4_4_) + fStack_fc;
      auVar152._8_4_ = fVar187 * (fStack_e4 * fVar95 + fStack_4f8) + fVar104 * fVar121;
      auVar152._12_4_ = fVar188 * (fStack_e4 * fVar86 + fStack_4f4) + fVar105 * fVar123;
      auVar152._16_4_ = (fStack_e4 * fVar96 + fStack_4f0) * 0.0 + fVar106 * fVar124;
      auVar152._20_4_ = (fStack_e4 * fVar87 + fStack_4ec) * 0.0 + fVar107 * fVar125;
      auVar152._24_4_ = (fStack_e4 * fVar97 + fStack_4e8) * 0.0 + fVar108 * fVar126;
      auVar152._28_4_ = fStack_4e4 + 0.0 + fStack_e4;
      local_e0 = local_460._0_4_ * fVar63;
      fStack_dc = local_460._4_4_ * fVar72;
      fStack_d8 = fVar104 * fVar73;
      fStack_d4 = fVar105 * fVar74;
      fStack_d0 = fVar106 * fVar75;
      fStack_cc = fVar107 * fVar76;
      fStack_c8 = fVar108 * fVar77;
      fStack_c4 = fStack_e4;
      auVar50._4_4_ = fStack_dc * fVar156;
      auVar50._0_4_ = local_e0 * fVar147;
      auVar50._8_4_ = fVar104 * fVar73 * fVar158;
      auVar50._12_4_ = fVar105 * fVar74 * fVar160;
      auVar50._16_4_ = fVar106 * fVar75 * fVar161;
      auVar50._20_4_ = fVar107 * fVar76 * fVar163;
      auVar50._24_4_ = fVar108 * fVar77 * fVar78;
      auVar50._28_4_ = local_4c0._28_4_;
      auVar165 = vsubps_avx(auVar152,auVar50);
      auVar109 = vpmovsxwd_avx2(auVar64);
      local_140._0_8_ = local_440._0_8_ ^ 0x8000000080000000;
      local_140._8_4_ = -fVar179;
      local_140._12_4_ = -fVar180;
      local_140._16_4_ = -fVar181;
      local_140._20_4_ = -fVar98;
      local_140._24_4_ = -fVar103;
      local_140._28_4_ = -fVar23;
      auVar102 = vblendvps_avx(local_440,local_140,auVar109);
      auVar65 = vpmovsxwd_avx2(auVar89);
      local_240 = vblendvps_avx(auVar102,auVar153,auVar65);
      local_160._0_8_ = local_460._0_8_ ^ 0x8000000080000000;
      local_160._8_4_ = -fVar104;
      local_160._12_4_ = -fVar105;
      local_160._16_4_ = -fVar106;
      local_160._20_4_ = -fVar107;
      local_160._24_4_ = -fVar108;
      local_160._28_4_ = local_460._28_4_ ^ 0x80000000;
      auVar102 = vblendvps_avx(local_460,local_160,auVar109);
      local_220 = vblendvps_avx(auVar102,auVar165,auVar65);
      auVar64 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar115,auVar115);
      auVar185 = ZEXT3264(local_480);
      local_2e0._4_4_ = fVar15 * fVar72;
      local_2e0._0_4_ = fVar162 * fVar63;
      fStack_2d8 = fVar16 * fVar73;
      fStack_2d4 = fVar17 * fVar74;
      fStack_2d0 = fVar18 * fVar75;
      fStack_2cc = fVar19 * fVar76;
      fStack_2c8 = fVar20 * fVar77;
      unique0x1000851a = 0;
      auVar166 = ZEXT3264(local_420);
      fStack_35c = fVar15 * fVar119;
      local_360 = fVar162 * fVar112;
      fStack_358 = fVar16 * fVar121;
      fStack_354 = fVar17 * fVar123;
      fStack_350 = fVar18 * fVar124;
      fStack_34c = fVar19 * fVar125;
      fStack_348 = fVar20 * fVar126;
      fStack_344 = auVar115._28_4_;
      auVar110._0_4_ = fVar162 * fVar112 + fVar183 * (fVar167 + fVar88 * local_2c0);
      auVar110._4_4_ = fVar15 * fVar119 + fVar186 * (fVar172 + fVar85 * local_2c0);
      auVar110._8_4_ = fVar16 * fVar121 + fVar187 * (fVar173 + fVar95 * local_2c0);
      auVar110._12_4_ = fVar17 * fVar123 + fVar188 * (fVar174 + fVar86 * local_2c0);
      auVar110._16_4_ = fVar18 * fVar124 + (fVar175 + fVar96 * local_2c0) * 0.0;
      auVar110._20_4_ = fVar19 * fVar125 + (fVar176 + fVar87 * local_2c0) * 0.0;
      auVar110._24_4_ = fVar20 * fVar126 + (fVar177 + fVar97 * local_2c0) * 0.0;
      auVar110._28_4_ = auVar115._28_4_ + local_420._28_4_ + fVar23 + 0.0;
      auVar51._4_4_ = fVar15 * fVar72 * fVar156;
      auVar51._0_4_ = fVar162 * fVar63 * fVar147;
      auVar51._8_4_ = fVar16 * fVar73 * fVar158;
      auVar51._12_4_ = fVar17 * fVar74 * fVar160;
      auVar51._16_4_ = fVar18 * fVar75 * fVar161;
      auVar51._20_4_ = fVar19 * fVar76 * fVar163;
      auVar51._24_4_ = fVar20 * fVar77 * fVar78;
      auVar51._28_4_ = 0;
      auVar153 = vsubps_avx(auVar110,auVar51);
      local_180._0_8_ = local_480._0_8_ ^ 0x8000000080000000;
      local_180._8_4_ = -fVar16;
      local_180._12_4_ = -fVar17;
      local_180._16_4_ = -fVar18;
      local_180._20_4_ = -fVar19;
      local_180._24_4_ = -fVar20;
      local_180._28_4_ = local_480._28_4_ ^ 0x80000000;
      auVar102 = vblendvps_avx(local_480,local_180,auVar109);
      local_200 = vblendvps_avx(auVar102,auVar153,auVar65);
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar71._16_4_ = 0x3f800000;
      auVar71._20_4_ = 0x3f800000;
      auVar71._24_4_ = 0x3f800000;
      auVar71._28_4_ = 0x3f800000;
      local_120 = vandnps_avx(auVar109,auVar71);
      _local_5c0 = ZEXT1632(auVar64);
      auVar52._4_4_ = auVar64._4_4_ * fVar156;
      auVar52._0_4_ = auVar64._0_4_ * fVar147;
      auVar52._8_4_ = auVar64._8_4_ * fVar158;
      auVar52._12_4_ = auVar64._12_4_ * fVar160;
      auVar52._16_4_ = fVar161 * 0.0;
      auVar52._20_4_ = fVar163 * 0.0;
      auVar52._24_4_ = fVar78 * 0.0;
      auVar52._28_4_ = auVar109._28_4_;
      local_2a0 = vblendvps_avx(local_120,auVar52,auVar65);
      local_260._0_4_ = fVar88 + fVar111;
      local_260._4_4_ = fVar85 + fVar118;
      local_260._8_4_ = fVar95 + fVar120;
      local_260._12_4_ = fVar86 + fVar122;
      local_260._16_4_ = fVar96 + 0.0;
      local_260._20_4_ = fVar87 + 0.0;
      local_260._24_4_ = fVar97 + 0.0;
      local_260._28_4_ = auVar141._28_4_ + 0.0;
      local_280 = ZEXT832(0) << 0x20;
      auVar64 = vpsllw_avx(local_340._0_16_,0xf);
      auVar64 = vpacksswb_avx(auVar64,auVar64);
      uVar62 = (ulong)(byte)(SUB161(auVar64 >> 7,0) & 1 | (SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar64 >> 0x37,0) & 1) << 6 | SUB161(auVar64 >> 0x3f,0) << 7);
      pauVar60 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
      auVar145 = ZEXT3264(_local_4e0);
      auVar154 = ZEXT3264(_local_500);
      auVar142 = ZEXT3264(local_440);
      auVar171 = ZEXT3264(local_460);
      auVar178 = ZEXT3264(local_540);
      local_630 = k;
      local_628 = pSVar59;
      local_618 = line;
      fStack_2bc = local_2c0;
      fStack_2b8 = local_2c0;
      fStack_2b4 = local_2c0;
      fStack_2b0 = local_2c0;
      fStack_2ac = local_2c0;
      fStack_2a8 = local_2c0;
      fStack_2a4 = local_2c0;
      do {
        auVar141 = auVar142._0_32_;
        local_610.valid = (int *)local_640;
        auVar165 = auVar166._0_32_;
        auVar153 = auVar154._0_32_;
        auVar102 = auVar145._0_32_;
        fVar147 = auVar132._28_4_;
        auVar115 = auVar178._0_32_;
        auVar65 = auVar185._0_32_;
        auVar109 = auVar171._0_32_;
        uVar21 = 0;
        for (uVar58 = uVar62; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
          uVar21 = uVar21 + 1;
        }
        local_390 = local_1a0[uVar21];
        pGVar12 = (pSVar59->geometries).items[local_390].ptr;
        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar61 = true, pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_0174ab23;
          uVar58 = (ulong)(uint)((int)uVar21 * 4);
          uVar1 = *(undefined4 *)(local_2a0 + uVar58);
          local_3c0._4_4_ = uVar1;
          local_3c0._0_4_ = uVar1;
          local_3c0._8_4_ = uVar1;
          local_3c0._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_280 + uVar58);
          local_3b0._4_4_ = uVar1;
          local_3b0._0_4_ = uVar1;
          local_3b0._8_4_ = uVar1;
          local_3b0._12_4_ = uVar1;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_260 + uVar58);
          local_610.context = context->user;
          uVar1 = *(undefined4 *)((long)&(local_618->primIDs).field_0 + uVar58);
          local_3a0._4_4_ = uVar1;
          local_3a0._0_4_ = uVar1;
          local_3a0._8_4_ = uVar1;
          local_3a0._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_240 + uVar58);
          local_3f0._4_4_ = uVar1;
          local_3f0._0_4_ = uVar1;
          local_3f0._8_4_ = uVar1;
          local_3f0._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_220 + uVar58);
          local_3e0._4_4_ = uVar1;
          local_3e0._0_4_ = uVar1;
          local_3e0._8_4_ = uVar1;
          local_3e0._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_200 + uVar58);
          local_3d0._4_4_ = uVar1;
          local_3d0._0_4_ = uVar1;
          local_3d0._8_4_ = uVar1;
          local_3d0._12_4_ = uVar1;
          auVar132 = ZEXT1664(local_3d0);
          vpcmpeqd_avx2(ZEXT1632(local_3c0),ZEXT1632(local_3c0));
          uStack_37c = (local_610.context)->instID[0];
          local_380 = uStack_37c;
          uStack_378 = uStack_37c;
          uStack_374 = uStack_37c;
          uStack_370 = (local_610.context)->instPrimID[0];
          uStack_36c = uStack_370;
          uStack_368 = uStack_370;
          uStack_364 = uStack_370;
          local_640 = *pauVar60;
          local_610.geometryUserPtr = pGVar12->userPtr;
          local_610.hit = local_3f0;
          local_610.N = 4;
          local_5e0._0_8_ = pauVar60;
          local_610.ray = (RTCRayN *)ray;
          uStack_38c = local_390;
          uStack_388 = local_390;
          uStack_384 = local_390;
          auVar64 = local_3b0;
          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar132 = ZEXT1664(local_3d0);
            (*pGVar12->occlusionFilterN)(&local_610);
            auVar178 = ZEXT3264(local_540);
            auVar185 = ZEXT3264(local_480);
            auVar171 = ZEXT3264(local_460);
            auVar142 = ZEXT3264(local_440);
            auVar166 = ZEXT3264(local_420);
            auVar154 = ZEXT3264(_local_500);
            auVar145 = ZEXT3264(_local_4e0);
            pSVar59 = local_628;
            pauVar60 = (undefined1 (*) [16])local_5e0._0_8_;
            k = local_630;
          }
          if (local_640 == (undefined1  [16])0x0) {
            auVar64 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar64 = auVar64 ^ auVar79;
          }
          else {
            p_Var14 = context->args->filter;
            auVar64 = vpcmpeqd_avx(auVar64,auVar64);
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
              auVar132 = ZEXT1664(auVar132._0_16_);
              (*p_Var14)(&local_610);
              auVar64 = vpcmpeqd_avx(auVar64,auVar64);
              auVar178 = ZEXT3264(local_540);
              auVar185 = ZEXT3264(local_480);
              auVar171 = ZEXT3264(local_460);
              auVar142 = ZEXT3264(local_440);
              auVar166 = ZEXT3264(local_420);
              auVar154 = ZEXT3264(_local_500);
              auVar145 = ZEXT3264(_local_4e0);
              pSVar59 = local_628;
              pauVar60 = (undefined1 (*) [16])local_5e0._0_8_;
            }
            auVar79 = vpcmpeqd_avx(local_640,(undefined1  [16])0x0);
            auVar64 = auVar79 ^ auVar64;
            auVar89._8_4_ = 0xff800000;
            auVar89._0_8_ = 0xff800000ff800000;
            auVar89._12_4_ = 0xff800000;
            auVar79 = vblendvps_avx(auVar89,*(undefined1 (*) [16])(local_610.ray + 0x80),auVar79);
            *(undefined1 (*) [16])(local_610.ray + 0x80) = auVar79;
          }
          auVar141 = auVar142._0_32_;
          auVar165 = auVar166._0_32_;
          auVar153 = auVar154._0_32_;
          auVar102 = auVar145._0_32_;
          fVar147 = auVar132._28_4_;
          auVar115 = auVar178._0_32_;
          auVar65 = auVar185._0_32_;
          auVar109 = auVar171._0_32_;
          auVar79._8_8_ = 0x100000001;
          auVar79._0_8_ = 0x100000001;
          if ((auVar79 & auVar64) != (undefined1  [16])0x0) {
            _local_560 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
            bVar61 = true;
            goto LAB_0174ab11;
          }
          *(int *)(ray + k * 4 + 0x80) = local_560._0_4_;
        }
        auVar141 = auVar142._0_32_;
        auVar165 = auVar166._0_32_;
        auVar153 = auVar154._0_32_;
        auVar102 = auVar145._0_32_;
        fVar147 = auVar132._28_4_;
        auVar115 = auVar178._0_32_;
        auVar65 = auVar185._0_32_;
        auVar109 = auVar171._0_32_;
        uVar62 = uVar62 ^ 1L << (uVar21 & 0x3f);
      } while (uVar62 != 0);
      bVar61 = false;
LAB_0174ab11:
LAB_0174ab23:
      auVar79 = vpand_avx(local_5a0,local_320);
      auVar83._4_4_ = local_560._0_4_;
      auVar83._0_4_ = local_560._0_4_;
      auVar83._8_4_ = local_560._0_4_;
      auVar83._12_4_ = local_560._0_4_;
      auVar83._16_4_ = local_560._0_4_;
      auVar83._20_4_ = local_560._0_4_;
      auVar83._24_4_ = local_560._0_4_;
      auVar83._28_4_ = local_560._0_4_;
      auVar84 = vcmpps_avx(local_580,auVar83,2);
      auVar64 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
      auVar64 = vpand_avx(auVar64,auVar79);
      auVar84 = vpmovzxwd_avx2(auVar64);
      auVar84 = vpslld_avx2(auVar84,0x1f);
      if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar84 >> 0x7f,0) == '\0') &&
            (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar84 >> 0xbf,0) == '\0') &&
          (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar84[0x1f])
      {
        return bVar61;
      }
      auVar91 = vcmpps_avx(local_a0,local_4c0,0);
      auVar84 = vblendvps_avx(auVar141,local_140,auVar91);
      auVar109 = vblendvps_avx(auVar109,local_160,auVar91);
      auVar65 = vblendvps_avx(auVar65,local_180,auVar91);
      auVar115 = vcmpps_avx(local_a0,auVar115,0);
      auVar91 = vcmpps_avx(local_a0,local_4a0,0);
      auVar115 = vorps_avx(auVar115,auVar91);
      fVar156 = local_a0._0_4_;
      fVar158 = local_a0._4_4_;
      fVar160 = local_a0._8_4_;
      fVar161 = local_a0._12_4_;
      fVar162 = local_a0._16_4_;
      fVar163 = local_a0._20_4_;
      fVar78 = local_a0._24_4_;
      auVar117._0_4_ =
           (float)local_1e0._0_4_ * (auVar102._0_4_ + fVar156 * (float)local_520._0_4_) + local_300;
      auVar117._4_4_ =
           (float)local_1e0._4_4_ * (auVar102._4_4_ + fVar158 * (float)local_520._4_4_) + fStack_2fc
      ;
      auVar117._8_4_ = fStack_1d8 * (auVar102._8_4_ + fVar160 * fStack_518) + fStack_2f8;
      auVar117._12_4_ = fStack_1d4 * (auVar102._12_4_ + fVar161 * fStack_514) + fStack_2f4;
      auVar117._16_4_ = fStack_1d0 * (auVar102._16_4_ + fVar162 * fStack_510) + fStack_2f0;
      auVar117._20_4_ = fStack_1cc * (auVar102._20_4_ + fVar163 * fStack_50c) + fStack_2ec;
      auVar117._24_4_ = fStack_1c8 * (auVar102._24_4_ + fVar78 * fStack_508) + fStack_2e8;
      auVar117._28_4_ = auVar102._28_4_ + auVar91._28_4_ + fStack_2e4;
      auVar131._0_4_ =
           (float)local_1e0._0_4_ * (auVar153._0_4_ + fVar156 * (float)local_1c0._0_4_) + local_100;
      auVar131._4_4_ =
           (float)local_1e0._4_4_ * (auVar153._4_4_ + fVar158 * (float)local_1c0._4_4_) + fStack_fc;
      auVar131._8_4_ = fStack_1d8 * (auVar153._8_4_ + fVar160 * fStack_1b8) + fStack_f8;
      auVar131._12_4_ = fStack_1d4 * (auVar153._12_4_ + fVar161 * fStack_1b4) + fStack_f4;
      auVar131._16_4_ = fStack_1d0 * (auVar153._16_4_ + fVar162 * fStack_1b0) + fStack_f0;
      auVar131._20_4_ = fStack_1cc * (auVar153._20_4_ + fVar163 * fStack_1ac) + fStack_ec;
      auVar131._24_4_ = fStack_1c8 * (auVar153._24_4_ + fVar78 * fStack_1a8) + fStack_e8;
      auVar131._28_4_ = auVar153._28_4_ + fVar147 + fStack_e4;
      auVar140._0_4_ = (float)local_1e0._0_4_ * (auVar165._0_4_ + fVar156 * local_2c0) + local_360;
      auVar140._4_4_ = (float)local_1e0._4_4_ * (auVar165._4_4_ + fVar158 * fStack_2bc) + fStack_35c
      ;
      auVar140._8_4_ = fStack_1d8 * (auVar165._8_4_ + fVar160 * fStack_2b8) + fStack_358;
      auVar140._12_4_ = fStack_1d4 * (auVar165._12_4_ + fVar161 * fStack_2b4) + fStack_354;
      auVar140._16_4_ = fStack_1d0 * (auVar165._16_4_ + fVar162 * fStack_2b0) + fStack_350;
      auVar140._20_4_ = fStack_1cc * (auVar165._20_4_ + fVar163 * fStack_2ac) + fStack_34c;
      auVar140._24_4_ = fStack_1c8 * (auVar165._24_4_ + fVar78 * fStack_2a8) + fStack_348;
      auVar140._28_4_ = auVar165._28_4_ + auVar141._28_4_ + fStack_344;
      fVar147 = local_80._0_4_;
      fVar156 = local_80._4_4_;
      auVar53._4_4_ = fVar156 * fStack_bc;
      auVar53._0_4_ = fVar147 * local_c0;
      fVar158 = local_80._8_4_;
      auVar53._8_4_ = fVar158 * fStack_b8;
      fVar160 = local_80._12_4_;
      auVar53._12_4_ = fVar160 * fStack_b4;
      fVar161 = local_80._16_4_;
      auVar53._16_4_ = fVar161 * fStack_b0;
      fVar162 = local_80._20_4_;
      auVar53._20_4_ = fVar162 * fStack_ac;
      fVar163 = local_80._24_4_;
      auVar53._24_4_ = fVar163 * fStack_a8;
      auVar53._28_4_ = uStack_1c4;
      auVar141 = vsubps_avx(auVar117,auVar53);
      auVar54._4_4_ = fVar156 * fStack_dc;
      auVar54._0_4_ = fVar147 * local_e0;
      auVar54._8_4_ = fVar158 * fStack_d8;
      auVar54._12_4_ = fVar160 * fStack_d4;
      auVar54._16_4_ = fVar161 * fStack_d0;
      auVar54._20_4_ = fVar162 * fStack_cc;
      auVar54._24_4_ = fVar163 * fStack_c8;
      auVar54._28_4_ = uStack_1c4;
      auVar102 = vsubps_avx(auVar131,auVar54);
      auVar55._4_4_ = fVar156 * (float)local_2e0._4_4_;
      auVar55._0_4_ = fVar147 * (float)local_2e0._0_4_;
      auVar55._8_4_ = fVar158 * fStack_2d8;
      auVar55._12_4_ = fVar160 * fStack_2d4;
      auVar55._16_4_ = fVar161 * fStack_2d0;
      auVar55._20_4_ = fVar162 * fStack_2cc;
      auVar55._24_4_ = fVar163 * fStack_2c8;
      auVar55._28_4_ = uStack_1c4;
      auVar153 = vsubps_avx(auVar140,auVar55);
      local_240 = vblendvps_avx(auVar84,auVar141,auVar115);
      local_220 = vblendvps_avx(auVar109,auVar102,auVar115);
      local_200 = vblendvps_avx(auVar65,auVar153,auVar115);
      auVar56._4_4_ = fVar156 * (float)local_5c0._4_4_;
      auVar56._0_4_ = fVar147 * (float)local_5c0._0_4_;
      auVar56._8_4_ = fVar158 * fStack_5b8;
      auVar56._12_4_ = fVar160 * fStack_5b4;
      auVar56._16_4_ = fVar161 * fStack_5b0;
      auVar56._20_4_ = fVar162 * fStack_5ac;
      auVar56._24_4_ = fVar163 * fStack_5a8;
      auVar56._28_4_ = auVar141._28_4_;
      local_2a0 = vblendvps_avx(local_120,auVar56,auVar115);
      local_280 = ZEXT832(0) << 0x20;
      local_260 = local_580;
      pSVar59 = context->scene;
      auVar64 = vpsllw_avx(auVar64,0xf);
      auVar64 = vpacksswb_avx(auVar64,auVar64);
      uVar62 = (ulong)(byte)(SUB161(auVar64 >> 7,0) & 1 | (SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar64 >> 0x37,0) & 1) << 6 | SUB161(auVar64 >> 0x3f,0) << 7);
      auVar141 = vpcmpeqd_avx2(auVar153,auVar153);
      auVar132 = ZEXT3264(auVar141);
      auVar142 = ZEXT464(0) << 0x20;
      auVar64 = vpcmpeqd_avx(local_80._0_16_,local_80._0_16_);
      auVar145 = ZEXT1664(auVar64);
      local_620 = ray;
      do {
        local_610.valid = (int *)local_640;
        uVar21 = 0;
        for (uVar58 = uVar62; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
          uVar21 = uVar21 + 1;
        }
        local_390 = local_1a0[uVar21];
        pGVar12 = (pSVar59->geometries).items[local_390].ptr;
        if ((pGVar12->mask & *(uint *)(local_620 + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar57 = 1, pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0174af1a;
          uVar58 = (ulong)(uint)((int)uVar21 * 4);
          local_3c0._4_4_ = *(undefined4 *)(local_2a0 + uVar58);
          uVar1 = *(undefined4 *)(local_280 + uVar58);
          local_3b0._4_4_ = uVar1;
          local_3b0._0_4_ = uVar1;
          local_3b0._8_4_ = uVar1;
          local_3b0._12_4_ = uVar1;
          *(undefined4 *)(local_620 + k * 4 + 0x80) = *(undefined4 *)(local_260 + uVar58);
          local_610.context = context->user;
          uVar1 = *(undefined4 *)((long)&(local_618->primIDs).field_0 + uVar58);
          local_3a0._4_4_ = uVar1;
          local_3a0._0_4_ = uVar1;
          local_3a0._8_4_ = uVar1;
          local_3a0._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_240 + uVar58);
          local_3f0._4_4_ = uVar1;
          local_3f0._0_4_ = uVar1;
          local_3f0._8_4_ = uVar1;
          local_3f0._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_220 + uVar58);
          local_3e0._4_4_ = uVar1;
          local_3e0._0_4_ = uVar1;
          local_3e0._8_4_ = uVar1;
          local_3e0._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_200 + uVar58);
          local_3d0._4_4_ = uVar1;
          local_3d0._0_4_ = uVar1;
          local_3d0._8_4_ = uVar1;
          local_3d0._12_4_ = uVar1;
          local_3c0._0_4_ = local_3c0._4_4_;
          local_3c0._8_4_ = local_3c0._4_4_;
          local_3c0._12_4_ = local_3c0._4_4_;
          uStack_37c = (local_610.context)->instID[0];
          local_380 = uStack_37c;
          uStack_378 = uStack_37c;
          uStack_374 = uStack_37c;
          uStack_370 = (local_610.context)->instPrimID[0];
          uStack_36c = uStack_370;
          uStack_368 = uStack_370;
          uStack_364 = uStack_370;
          local_640 = *pauVar60;
          local_610.geometryUserPtr = pGVar12->userPtr;
          local_610.hit = local_3f0;
          local_610.N = 4;
          local_5e0._0_8_ = pauVar60;
          local_610.ray = (RTCRayN *)local_620;
          uStack_38c = local_390;
          uStack_388 = local_390;
          uStack_384 = local_390;
          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar141 = ZEXT1632(auVar132._0_16_);
            auVar64 = auVar145._0_16_;
            (*pGVar12->occlusionFilterN)(&local_610);
            auVar64 = vpcmpeqd_avx(auVar64,auVar64);
            auVar145 = ZEXT1664(auVar64);
            auVar142 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar141 = vpcmpeqd_avx2(auVar141,auVar141);
            auVar132 = ZEXT3264(auVar141);
            pauVar60 = (undefined1 (*) [16])local_5e0._0_8_;
            k = local_630;
          }
          auVar64 = auVar145._0_16_;
          if (local_640 == (undefined1  [16])0x0) {
            auVar79 = vpcmpeqd_avx(auVar142._0_16_,(undefined1  [16])0x0);
            auVar64 = auVar64 ^ auVar79;
          }
          else {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
              auVar141 = ZEXT1632(auVar132._0_16_);
              (*p_Var14)(&local_610);
              auVar64 = vpcmpeqd_avx(auVar64,auVar64);
              auVar145 = ZEXT1664(auVar64);
              auVar142 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar141 = vpcmpeqd_avx2(auVar141,auVar141);
              auVar132 = ZEXT3264(auVar141);
              pauVar60 = (undefined1 (*) [16])local_5e0._0_8_;
              k = local_630;
            }
            auVar79 = vpcmpeqd_avx(auVar142._0_16_,local_640);
            auVar64 = auVar145._0_16_ ^ auVar79;
            auVar90._8_4_ = 0xff800000;
            auVar90._0_8_ = 0xff800000ff800000;
            auVar90._12_4_ = 0xff800000;
            auVar79 = vblendvps_avx(auVar90,*(undefined1 (*) [16])(local_610.ray + 0x80),auVar79);
            *(undefined1 (*) [16])(local_610.ray + 0x80) = auVar79;
          }
          auVar80._8_8_ = 0x100000001;
          auVar80._0_8_ = 0x100000001;
          if ((auVar80 & auVar64) != (undefined1  [16])0x0) {
            bVar57 = 1;
            goto LAB_0174af1a;
          }
          *(undefined4 *)(local_620 + k * 4 + 0x80) = local_560._0_4_;
        }
        uVar62 = uVar62 ^ 1L << (uVar21 & 0x3f);
        if (uVar62 == 0) {
          bVar57 = 0;
LAB_0174af1a:
          return (bool)(bVar61 | bVar57);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }